

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

bool anon_unknown.dwarf_23372c::WindowsImplX11Impl::ewmhSupported(void)

{
  Atom AVar1;
  char *begin_00;
  String *pSVar2;
  char *end;
  char *begin;
  Atom utf8StringType;
  Atom netWmName;
  Window childWindow;
  Window rootWindow;
  int result;
  uchar *data;
  unsigned_long numBytes;
  unsigned_long numItems;
  int actualFormat;
  Atom actualType;
  Display *display;
  Atom netSupported;
  Atom netSupportingWmCheck;
  String *right;
  Display *pDVar3;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 onlyIfExists;
  string *in_stack_fffffffffffffe58;
  allocator *end_00;
  allocator local_131;
  string local_130 [32];
  String *local_110;
  allocator local_101;
  string local_100 [32];
  Atom local_e0;
  long local_d8;
  long local_d0;
  int local_c4;
  long *local_c0;
  undefined1 local_b8 [8];
  long local_b0;
  undefined1 local_a4 [4];
  undefined1 local_a0 [24];
  string local_88 [32];
  char *local_68;
  allocator local_49;
  string local_48 [32];
  Atom local_28;
  undefined1 local_19;
  
  onlyIfExists = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  if (ewmhSupported::checked) {
    local_19 = ewmhSupported::ewmhSupported;
  }
  else {
    ewmhSupported::checked = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"_NET_SUPPORTING_WM_CHECK",&local_49);
    AVar1 = sf::priv::getAtom(in_stack_fffffffffffffe58,(bool)onlyIfExists);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_28 = AVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"_NET_SUPPORTED",(allocator *)(local_a0 + 0x17));
    begin_00 = (char *)sf::priv::getAtom(in_stack_fffffffffffffe58,(bool)onlyIfExists);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x17));
    if ((local_28 == 0) || (begin_00 == (char *)0x0)) {
      local_19 = 0;
    }
    else {
      local_68 = begin_00;
      local_a0._8_8_ = sf::priv::OpenDisplay();
      pDVar3 = (Display *)&local_b0;
      local_c4 = XGetWindowProperty(local_a0._8_8_,
                                    *(undefined8 *)
                                     (*(long *)(local_a0._8_8_ + 0xe8) +
                                      (long)*(int *)(local_a0._8_8_ + 0xe0) * 0x80 + 0x10),local_28,
                                    0,1,0,0x21,local_a0,local_a4,pDVar3,local_b8,&local_c0);
      if ((local_c4 == 0) && (((pointer)local_a0._0_8_ == (pointer)0x21 && (local_b0 == 1)))) {
        local_d0 = *local_c0;
        XFree(local_c0);
        if (local_d0 == 0) {
          sf::priv::CloseDisplay(pDVar3);
          local_19 = 0;
        }
        else {
          pDVar3 = (Display *)&local_b0;
          local_c4 = XGetWindowProperty(local_a0._8_8_,local_d0,local_28,0,1,0,0x21,local_a0,
                                        local_a4,pDVar3,local_b8,&local_c0);
          if (((local_c4 == 0) && ((pointer)local_a0._0_8_ == (pointer)0x21)) && (local_b0 == 1)) {
            local_d8 = *local_c0;
            XFree(local_c0);
            if (local_d8 == 0) {
              sf::priv::CloseDisplay(pDVar3);
              local_19 = 0;
            }
            else if (local_d0 == local_d8) {
              ewmhSupported::ewmhSupported = true;
              end_00 = &local_101;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_100,"_NET_WM_NAME",end_00);
              AVar1 = sf::priv::getAtom(in_stack_fffffffffffffe58,(bool)onlyIfExists);
              std::__cxx11::string::~string(local_100);
              std::allocator<char>::~allocator((allocator<char> *)&local_101);
              local_e0 = AVar1;
              if (AVar1 == 0) {
                sf::priv::CloseDisplay(pDVar3);
                local_19 = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_130,"UTF8_STRING",&local_131);
                pSVar2 = (String *)sf::priv::getAtom(in_stack_fffffffffffffe58,(bool)onlyIfExists);
                std::__cxx11::string::~string(local_130);
                std::allocator<char>::~allocator((allocator<char> *)&local_131);
                local_110 = pSVar2;
                if (pSVar2 == (String *)0x0) {
                  local_110 = (String *)0x1f;
                }
                pSVar2 = (String *)local_a0;
                pDVar3 = (Display *)&local_b0;
                right = local_110;
                local_c4 = XGetWindowProperty(local_a0._8_8_,local_d0,local_e0,0,0x7fffffff,0,
                                              local_110,pSVar2,local_a4,pDVar3,local_b8,&local_c0);
                if (((pointer)local_a0._0_8_ != (pointer)0x0) && (local_b0 != 0)) {
                  sf::String::fromUtf8<char_const*>(begin_00,(char *)end_00);
                  sf::String::operator=(pSVar2,right);
                  sf::String::~String((String *)0x264834);
                }
                if (local_c4 == 0) {
                  XFree(local_c0);
                }
                sf::priv::CloseDisplay(pDVar3);
                local_19 = 1;
              }
            }
            else {
              sf::priv::CloseDisplay(pDVar3);
              local_19 = 0;
            }
          }
          else {
            if (local_c4 == 0) {
              XFree(local_c0);
            }
            sf::priv::CloseDisplay(pDVar3);
            local_19 = 0;
          }
        }
      }
      else {
        if (local_c4 == 0) {
          XFree(local_c0);
        }
        sf::priv::CloseDisplay(pDVar3);
        local_19 = 0;
      }
    }
  }
  return (bool)local_19;
}

Assistant:

bool ewmhSupported()
        {
            static bool checked = false;
            static bool ewmhSupported = false;

            if (checked)
                return ewmhSupported;

            checked = true;

            Atom netSupportingWmCheck = sf::priv::getAtom("_NET_SUPPORTING_WM_CHECK", true);
            Atom netSupported = sf::priv::getAtom("_NET_SUPPORTED", true);

            if (!netSupportingWmCheck || !netSupported)
                return false;

            ::Display* display = sf::priv::OpenDisplay();

            Atom actualType;
            int actualFormat;
            unsigned long numItems;
            unsigned long numBytes;
            unsigned char* data;

            int result = XGetWindowProperty(display,
                                            DefaultRootWindow(display),
                                            netSupportingWmCheck,
                                            0,
                                            1,
                                            False,
                                            XA_WINDOW,
                                            &actualType,
                                            &actualFormat,
                                            &numItems,
                                            &numBytes,
                                            &data);

            if (result != Success || actualType != XA_WINDOW || numItems != 1)
            {
                if (result == Success)
                    XFree(data);

                sf::priv::CloseDisplay(display);
                return false;
            }

            #pragma GCC diagnostic push
            #pragma GCC diagnostic ignored "-Wcast-align"
            ::Window rootWindow = *reinterpret_cast< ::Window* >(data);
            #pragma GCC diagnostic pop

            XFree(data);

            if (!rootWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            result = XGetWindowProperty(display,
                                        rootWindow,
                                        netSupportingWmCheck,
                                        0,
                                        1,
                                        False,
                                        XA_WINDOW,
                                        &actualType,
                                        &actualFormat,
                                        &numItems,
                                        &numBytes,
                                        &data);

            if (result != Success || actualType != XA_WINDOW || numItems != 1)
            {
                if (result == Success)
                    XFree(data);

                sf::priv::CloseDisplay(display);
                return false;
            }

            #pragma GCC diagnostic push
            #pragma GCC diagnostic ignored "-Wcast-align"
            ::Window childWindow = *reinterpret_cast< ::Window* >(data);
            #pragma GCC diagnostic pop

            XFree(data);

            if (!childWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            // Conforming window managers should return the same window for both queries
            if (rootWindow != childWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            ewmhSupported = true;

            // We try to get the name of the window manager
            // for window manager specific workarounds
            Atom netWmName = sf::priv::getAtom("_NET_WM_NAME", true);

            if (!netWmName)
            {
                sf::priv::CloseDisplay(display);
                return true;
            }

            Atom utf8StringType = sf::priv::getAtom("UTF8_STRING");

            if (!utf8StringType)
                utf8StringType = XA_STRING;

            result = XGetWindowProperty(display,
                                        rootWindow,
                                        netWmName,
                                        0,
                                        0x7fffffff,
                                        False,
                                        utf8StringType,
                                        &actualType,
                                        &actualFormat,
                                        &numItems,
                                        &numBytes,
                                        &data);

            if (actualType && numItems)
            {
                // It seems the wm name string reply is not necessarily
                // null-terminated. The work around is to get its actual
                // length to build a proper string
                const char* begin = reinterpret_cast<const char*>(data);
                const char* end = begin + numItems;
                windowManagerName = sf::String::fromUtf8(begin, end);
            }

            if (result == Success)
                XFree(data);

            sf::priv::CloseDisplay(display);

            return true;
        }